

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall
test_flash_attn_ext::build_graph(test_flash_attn_ext *this,ggml_context *ctx)

{
  long lVar1;
  long lVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  test_case *this_00;
  ulong ne3;
  ulong ne3_00;
  int64_t in_RSI;
  long in_RDI;
  float fVar6;
  int64_t unaff_retaddr;
  ggml_type in_stack_0000000c;
  anon_class_16_2_633b7154 *in_stack_00000010;
  ggml_tensor *out;
  ggml_tensor *m;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *q;
  anon_class_16_2_633b7154 *create_permuted;
  int64_t hsv_padded;
  int64_t hsk_padded;
  int64_t in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  ggml_type type;
  ggml_context *ctx_00;
  ggml_tensor *local_58;
  undefined1 local_38 [8];
  undefined1 *local_30;
  undefined1 *local_28;
  ulong local_20;
  long ne1;
  
  type = (ggml_type)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  ctx_00 = *(ggml_context **)(in_RDI + 0x38);
  ne1 = in_RDI;
  lVar1 = ggml_blck_size(*(undefined4 *)(in_RDI + 0x78));
  this_00 = (test_case *)(ctx_00 + lVar1 + -1);
  lVar1 = ggml_blck_size(*(undefined4 *)(in_RDI + 0x78));
  ne3 = (ulong)this_00 & (lVar1 - 1U ^ 0xffffffffffffffff);
  lVar1 = *(long *)(in_RDI + 0x40);
  lVar2 = ggml_blck_size(*(undefined4 *)(in_RDI + 0x78));
  ne3_00 = (lVar1 + lVar2) - 1;
  lVar1 = ggml_blck_size(*(undefined4 *)(in_RDI + 0x78));
  local_20 = ne3_00 & (lVar1 - 1U ^ 0xffffffffffffffff);
  local_30 = &stack0xfffffffffffffff0;
  local_28 = local_38;
  pgVar3 = build_graph::anon_class_16_2_633b7154::operator()
                     (in_stack_00000010,in_stack_0000000c,unaff_retaddr,ne1,in_RSI,ne3);
  ggml_set_name(pgVar3,"q");
  pgVar4 = build_graph::anon_class_16_2_633b7154::operator()
                     (in_stack_00000010,in_stack_0000000c,unaff_retaddr,ne1,in_RSI,ne3);
  ggml_set_name(pgVar4,"k");
  pgVar5 = build_graph::anon_class_16_2_633b7154::operator()
                     (in_stack_00000010,in_stack_0000000c,unaff_retaddr,ne1,in_RSI,ne3);
  ggml_set_name(pgVar5,"v");
  local_58 = (ggml_tensor *)0x0;
  if ((*(byte *)(in_RDI + 0x68) & 1) != 0) {
    local_58 = test_case::ggml_new_tensor_4d
                         (this_00,ctx_00,type,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58,ne3_00);
    ggml_set_name(local_58,"m");
  }
  fVar6 = sqrtf((float)*(long *)(in_RDI + 0x38));
  pgVar3 = (ggml_tensor *)
           ggml_flash_attn_ext(1.0 / fVar6,*(undefined4 *)(in_RDI + 0x6c),
                               *(undefined4 *)(in_RDI + 0x70),in_RSI,pgVar3,pgVar4,pgVar5,local_58);
  ggml_flash_attn_ext_set_prec(pgVar3,*(undefined4 *)(in_RDI + 0x74));
  ggml_set_name(pgVar3,"out");
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        const int64_t hsk_padded = GGML_PAD(hsk, ggml_blck_size(type_KV));
        const int64_t hsv_padded = GGML_PAD(hsv, ggml_blck_size(type_KV));

        auto const &create_permuted = [&](ggml_type type, int64_t ne0, int64_t ne1, int64_t ne2, int64_t ne3) -> ggml_tensor * {
            int64_t ne[4] = {ne0, ne1, ne2, ne3};
            int64_t ne_perm[4];
            for (int i = 0; i < 4; ++i) {
                ne_perm[permute[i]] = ne[i];
            }
            ggml_tensor * t = ggml_new_tensor_4d(ctx, type, ne_perm[0], ne_perm[1], ne_perm[2], ne_perm[3]);
            if (permute != std::array<int32_t, 4>{0, 1, 2, 3}) {
                t = ggml_permute(ctx, t, permute[0], permute[1], permute[2], permute[3]);
            }
            return t;
        };

        ggml_tensor * q = create_permuted(GGML_TYPE_F32, hsk_padded, nb, nh*nr, 1);
        ggml_set_name(q, "q");

        ggml_tensor * k = create_permuted(type_KV,       hsk_padded, kv, nh,    1);
        ggml_set_name(k, "k");

        ggml_tensor * v = create_permuted(type_KV,       hsv_padded, kv, nh,    1);
        ggml_set_name(v, "v");

        ggml_tensor * m = nullptr;
        if (mask) {
            m = ggml_new_tensor_4d(ctx, GGML_TYPE_F16, kv, GGML_PAD(nb, GGML_KQ_MASK_PAD), 1, 1);
            ggml_set_name(m, "m");
        }

        ggml_tensor * out = ggml_flash_attn_ext(ctx, q, k, v, m, 1.0f/sqrtf(hsk), max_bias, logit_softcap);
        ggml_flash_attn_ext_set_prec(out, prec);
        ggml_set_name(out, "out");

        return out;
    }